

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int z_deflateParams(z_streamp strm,int level,int strategy)

{
  internal_state *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = -2;
  if ((strm != (z_streamp)0x0) && (piVar1 = strm->state, piVar1 != (internal_state *)0x0)) {
    uVar4 = 6;
    if (level != -1) {
      uVar4 = level;
    }
    if ((uint)strategy < 5 && uVar4 < 10) {
      uVar3 = piVar1->level;
      iVar2 = 0;
      if ((configuration_table[(int)uVar3].func != configuration_table[uVar4].func) &&
         (strm->total_in != 0)) {
        iVar2 = z_deflate(strm,1);
        uVar3 = piVar1->level;
      }
      if (uVar3 != uVar4) {
        piVar1->level = uVar4;
        piVar1->max_lazy_match = (uint)configuration_table[uVar4].max_lazy;
        piVar1->good_match = (uint)configuration_table[uVar4].good_length;
        piVar1->nice_match = (uint)configuration_table[uVar4].nice_length;
        piVar1->max_chain_length = (uint)configuration_table[uVar4].max_chain;
      }
      piVar1->strategy = strategy;
    }
  }
  return iVar2;
}

Assistant:

int ZEXPORT deflateParams(strm, level, strategy)
    z_streamp strm;
    int level;
    int strategy;
{
    deflate_state *s;
    compress_func func;
    int err = Z_OK;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    s = strm->state;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    func = configuration_table[s->level].func;

    if (func != configuration_table[level].func && strm->total_in != 0) {
        /* Flush the last buffer: */
        err = deflate(strm, Z_PARTIAL_FLUSH);
    }
    if (s->level != level) {
        s->level = level;
        s->max_lazy_match   = configuration_table[level].max_lazy;
        s->good_match       = configuration_table[level].good_length;
        s->nice_match       = configuration_table[level].nice_length;
        s->max_chain_length = configuration_table[level].max_chain;
    }
    s->strategy = strategy;
    return err;
}